

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_expose.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char *format;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  ALLEGRO_EVENT event;
  int local_78 [2];
  undefined8 local_70;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    al_init_primitives_addon();
    al_init_image_addon();
    al_install_keyboard();
    al_install_mouse();
    al_set_new_display_flags(0x50);
    al_set_new_display_option(0x16,1,1);
    lVar4 = al_create_display(0x140,200);
    if (lVar4 == 0) {
      format = "Error creating display\n";
    }
    else {
      lVar5 = al_load_bitmap("data/mysha.pcx");
      if (lVar5 != 0) {
        al_draw_bitmap(0,0,lVar5,0);
        al_flip_display();
        uVar6 = al_create_timer(0x3fb999999999999a);
        uVar7 = al_create_event_queue();
        uVar8 = al_get_keyboard_event_source();
        al_register_event_source(uVar7,uVar8);
        uVar8 = al_get_mouse_event_source();
        al_register_event_source(uVar7,uVar8);
        uVar8 = al_get_display_event_source(lVar4);
        al_register_event_source(uVar7,uVar8);
        uVar8 = al_get_timer_event_source(uVar6);
        al_register_event_source(uVar7,uVar8);
        al_start_timer(uVar6);
        al_wait_for_event(uVar7,local_78);
        while ((local_78[0] != 0x2a && ((local_78[0] != 10 || (local_58 != 0x3b))))) {
          if (local_78[0] == 0x29) {
            al_acknowledge_resize(local_70);
          }
          iVar3 = local_5c;
          iVar2 = local_60;
          if (local_78[0] == 0x28) {
            iVar9 = local_58 + local_60;
            iVar10 = local_54 + local_5c;
            al_set_blender(0,1,0);
            uVar12 = 0;
            uVar11 = al_map_rgba_f(0x3f800000,0,0,0x3f800000);
            al_draw_filled_rectangle
                      ((float)iVar2,(float)iVar3,(float)iVar9,(float)iVar10,uVar11,uVar12);
            al_flip_display();
          }
          if (local_78[0] == 0x1e) {
            al_set_blender(0,2,3);
            iVar2 = al_get_display_height(lVar4);
            if (0 < iVar2) {
              iVar2 = 0;
              do {
                iVar3 = al_get_display_width(lVar4);
                if (0 < iVar3) {
                  iVar3 = 0;
                  do {
                    al_map_rgba_f(0x3f800000,0x3f800000,0x3f800000,0x3dcccccd);
                    al_draw_tinted_bitmap(lVar5,0);
                    iVar3 = iVar3 + 0x140;
                    iVar9 = al_get_display_width(lVar4);
                  } while (iVar3 < iVar9);
                }
                iVar2 = iVar2 + 200;
                iVar3 = al_get_display_height(lVar4);
              } while (iVar2 < iVar3);
            }
            al_flip_display();
          }
          al_wait_for_event(uVar7,local_78);
        }
        al_destroy_event_queue(uVar7);
        al_destroy_bitmap(lVar5);
        return 0;
      }
      format = "mysha.pcx not found or failed to load\n";
    }
  }
  abort_example(format);
  iVar2 = __cxa_atexit();
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_BITMAP *bitmap;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_init_primitives_addon();
   al_init_image_addon();
   al_install_keyboard();
   al_install_mouse();
   init_platform_specific();

   al_set_new_display_flags(ALLEGRO_RESIZABLE |
      ALLEGRO_GENERATE_EXPOSE_EVENTS);
   al_set_new_display_option(ALLEGRO_SINGLE_BUFFER, true, ALLEGRO_REQUIRE);
   display = al_create_display(320, 200);
   if (!display) {
      abort_example("Error creating display\n");
   }

   bitmap = al_load_bitmap("data/mysha.pcx");
   if (!bitmap) {
      abort_example("mysha.pcx not found or failed to load\n");
   }
   al_draw_bitmap(bitmap, 0, 0, 0);
   al_flip_display();

   timer = al_create_timer(0.1);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_start_timer(timer);

   while (true) {
      ALLEGRO_EVENT event;
      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE)
            break;
      if (event.type == ALLEGRO_EVENT_KEY_DOWN &&
         event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
         break;
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_RESIZE) {
         al_acknowledge_resize(event.display.source);
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_EXPOSE) {
         int x = event.display.x,
            y = event.display.y, 
            w = event.display.width,
            h = event.display.height;
         /* Draw a red rectangle over the damaged area. */
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);
         al_draw_filled_rectangle(x, y, x + w, y + h, al_map_rgba_f(1, 0, 0, 1));
         al_flip_display();
      }
      if (event.type == ALLEGRO_EVENT_TIMER) {
         /* Slowly restore the original bitmap. */
         int x, y;
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ALPHA, ALLEGRO_INVERSE_ALPHA);
         for (y = 0; y < al_get_display_height(display); y += 200) {
            for (x = 0; x < al_get_display_width(display); x += 320) {
               al_draw_tinted_bitmap(bitmap, al_map_rgba_f(1, 1, 1, 0.1), x, y, 0);
            }
         }
         al_flip_display();
      }
   }

   al_destroy_event_queue(queue);
   al_destroy_bitmap(bitmap);

   return 0;
}